

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_utils.c
# Opt level: O3

void End(WebPWorker *worker)

{
  pthread_mutex_t *__mutex;
  WebPWorkerImpl *impl;
  
  __mutex = (pthread_mutex_t *)worker->impl;
  if (__mutex != (pthread_mutex_t *)0x0) {
    ChangeState(worker,NOT_OK);
    pthread_join(*(pthread_t *)((long)__mutex + 0x58),(void **)0x0);
    pthread_mutex_destroy(__mutex);
    pthread_cond_destroy((pthread_cond_t *)(__mutex + 1));
    WebPSafeFree(__mutex);
    worker->impl = (void *)0x0;
  }
  return;
}

Assistant:

static void End(WebPWorker* const worker) {
#ifdef WEBP_USE_THREAD
  if (worker->impl != NULL) {
    WebPWorkerImpl* const impl = (WebPWorkerImpl*)worker->impl;
    ChangeState(worker, NOT_OK);
    pthread_join(impl->thread, NULL);
    pthread_mutex_destroy(&impl->mutex);
    pthread_cond_destroy(&impl->condition);
    WebPSafeFree(impl);
    worker->impl = NULL;
  }
#else
  worker->status = NOT_OK;
  assert(worker->impl == NULL);
#endif
  assert(worker->status == NOT_OK);
}